

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O0

void __thiscall adios2::core::Attribute<unsigned_short>::~Attribute(Attribute<unsigned_short> *this)

{
  undefined8 *in_RDI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Attribute_0112b0e0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(unaff_retaddr);
  AttributeBase::~AttributeBase((AttributeBase *)0x82da64);
  return;
}

Assistant:

~Attribute() = default;